

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

QModelIndexList * __thiscall
QTableView::selectedIndexes(QModelIndexList *__return_storage_ptr__,QTableView *this)

{
  long lVar1;
  char cVar2;
  undefined8 *puVar3;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar4;
  long in_FS_OFFSET;
  QArrayData *local_88;
  QModelIndex local_70;
  QArrayData *local_58;
  undefined8 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (((*(long *)(lVar1 + 800) == 0) || (*(int *)(*(long *)(lVar1 + 800) + 4) == 0)) ||
     (*(long *)(lVar1 + 0x328) == 0)) {
    local_88 = (QArrayData *)0x0;
    puVar3 = (undefined8 *)0x0;
    tVar4.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    QItemSelectionModel::selectedIndexes();
    tVar4.ptr = local_48.ptr;
    puVar3 = puStack_50;
    local_88 = local_58;
    local_58 = (QArrayData *)0x0;
    puStack_50 = (undefined8 *)0x0;
    local_48.ptr = (QAbstractItemModel *)0x0;
  }
  if (tVar4.ptr != (QAbstractItemModel *)0x0) {
    do {
      local_58 = (QArrayData *)*puVar3;
      puStack_50 = (undefined8 *)puVar3[1];
      local_48.ptr = (QAbstractItemModel *)puVar3[2];
      cVar2 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2c0))
                        (this,(QModelIndex *)&local_58);
      if (cVar2 == '\0') {
        if (local_48.ptr == (QAbstractItemModel *)0x0) {
          local_70.r = -1;
          local_70.c = -1;
          local_70.i = 0;
          local_70.m.ptr = (QAbstractItemModel *)0x0;
        }
        else {
          (**(code **)(*(long *)local_48.ptr + 0x68))
                    (&local_70,local_48.ptr,(QModelIndex *)&local_58);
        }
        cVar2 = comparesEqual((QPersistentModelIndex *)(lVar1 + 0x3b8),&local_70);
        if (cVar2 != '\0') {
          QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                    ((QMovableArrayOps<QModelIndex> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,(QModelIndex *)&local_58);
          QList<QModelIndex>::end(__return_storage_ptr__);
        }
      }
      puVar3 = puVar3 + 3;
      tVar4.ptr = tVar4.ptr + -1;
    } while (tVar4.ptr != (QAbstractItemModel *)0x0);
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndexList QTableView::selectedIndexes() const
{
    Q_D(const QTableView);
    QModelIndexList viewSelected;
    QModelIndexList modelSelected;
    if (d->selectionModel)
        modelSelected = d->selectionModel->selectedIndexes();
    for (int i = 0; i < modelSelected.size(); ++i) {
        QModelIndex index = modelSelected.at(i);
        if (!isIndexHidden(index) && index.parent() == d->root)
            viewSelected.append(index);
    }
    return viewSelected;
}